

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementInstancer.cpp
# Opt level: O3

void __thiscall
Rml::ElementInstancerElement::ReleaseElement(ElementInstancerElement *this,Element *element)

{
  _func_int **pp_Var1;
  ObserverPtrBlock *pOVar2;
  code *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  _func_int **pp_Var6;
  
  if ((element_instancer_pools._8_8_ == 0) &&
     (bVar5 = Assert("Resource used before it was initialized, or after it was shut down.",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                     ,0x46), !bVar5)) {
LAB_0022b418:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  uVar4 = element_instancer_pools._8_8_;
  *(int *)(element_instancer_pools._8_8_ + 0x20) =
       *(int *)(element_instancer_pools._8_8_ + 0x20) + -1;
  (**(element->super_ScriptInterface).super_Releasable._vptr_Releasable)(element);
  pp_Var1 = element[1].super_ScriptInterface.super_Releasable._vptr_Releasable;
  pOVar2 = element[1].super_EnableObserverPtr<Rml::Element>.block;
  if (pp_Var1 == (_func_int **)0x0) {
    pp_Var6 = (_func_int **)(uVar4 + 0x10);
    if ((*(Element **)(uVar4 + 0x10) != element) &&
       (bVar5 = Assert("RMLUI_ASSERT(first_allocated_node == object)",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Pool.inl"
                       ,0xa5), !bVar5)) goto LAB_0022b418;
  }
  else {
    pp_Var6 = pp_Var1 + 0x32;
  }
  *pp_Var6 = (_func_int *)pOVar2;
  if (pOVar2 != (ObserverPtrBlock *)0x0) {
    pOVar2[0x18].pointed_to_object = pp_Var1;
  }
  pOVar2 = *(ObserverPtrBlock **)(uVar4 + 0x18);
  element[1].super_ScriptInterface.super_Releasable._vptr_Releasable = (_func_int **)0x0;
  element[1].super_EnableObserverPtr<Rml::Element>.block = pOVar2;
  *(Element **)(uVar4 + 0x18) = element;
  return;
}

Assistant:

void ElementInstancerElement::ReleaseElement(Element* element)
{
	element_instancer_pools->pool_element.DestroyAndDeallocate(element);
}